

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.hpp
# Opt level: O1

int util::load<int,util::little_endian>(istream *is,size_t bits)

{
  int *piVar1;
  char buffer [1];
  char buffer_1 [2];
  char buffer_2 [4];
  char local_13;
  short local_12;
  int local_10;
  int local_c;
  
  if (bits == 0x20) {
    piVar1 = &local_10;
  }
  else {
    if (bits == 0x10) {
      std::istream::read((char *)is,(long)&local_12);
      return (int)local_12;
    }
    if (bits == 8) {
      std::istream::read((char *)is,(long)&local_13);
      return (int)local_13;
    }
    piVar1 = &local_c;
  }
  std::istream::read((char *)is,(long)piVar1);
  return *piVar1;
}

Assistant:

T load(std::istream & is, size_t bits) {
	if(bits == 8) {
		return load<typename compatible_integer<T, 8>::type, Endianness>(is);
	} else if(bits == 16) {
		return load<typename compatible_integer<T, 16>::type, Endianness>(is);
	} else if(bits == 32) {
		return load<typename compatible_integer<T, 32>::type, Endianness>(is);
	} else {
		return load<typename compatible_integer<T, 64>::type, Endianness>(is);
	}
}